

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int header_odc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  int iVar1;
  void *pvVar2;
  dev_t dVar3;
  int64_t iVar4;
  size_t sVar5;
  int r2;
  char *header;
  int r;
  void *h;
  size_t *name_pad_local;
  size_t *namelength_local;
  archive_entry *entry_local;
  cpio *cpio_local;
  archive_read *a_local;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  iVar1 = find_odc_header(a);
  a_local._4_4_ = iVar1;
  if (-0x15 < iVar1) {
    if ((a->archive).archive_format == 0x10006) {
      a_local._4_4_ = header_afiol(a,cpio,entry,namelength,name_pad);
      if (a_local._4_4_ == 0) {
        a_local._4_4_ = iVar1;
      }
    }
    else {
      pvVar2 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
      if (pvVar2 == (void *)0x0) {
        a_local._4_4_ = -0x1e;
      }
      else {
        dVar3 = atol8((char *)((long)pvVar2 + 6),6);
        archive_entry_set_dev(entry,dVar3);
        iVar4 = atol8((char *)((long)pvVar2 + 0xc),6);
        archive_entry_set_ino(entry,iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x12),6);
        archive_entry_set_mode(entry,(mode_t)iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x18),6);
        archive_entry_set_uid(entry,iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x1e),6);
        archive_entry_set_gid(entry,iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x24),6);
        archive_entry_set_nlink(entry,(uint)iVar4);
        dVar3 = atol8((char *)((long)pvVar2 + 0x2a),6);
        archive_entry_set_rdev(entry,dVar3);
        iVar4 = atol8((char *)((long)pvVar2 + 0x30),0xb);
        archive_entry_set_mtime(entry,iVar4,0);
        sVar5 = atol8((char *)((long)pvVar2 + 0x3b),6);
        *namelength = sVar5;
        *name_pad = 0;
        iVar4 = atol8((char *)((long)pvVar2 + 0x41),0xb);
        cpio->entry_bytes_remaining = iVar4;
        archive_entry_set_size(entry,cpio->entry_bytes_remaining);
        cpio->entry_padding = 0;
        __archive_read_consume(a,0x4c);
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}